

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertDoublesEqual
          (UtestShell *this,double expected,double actual,double threshold,char *text,char *fileName
          ,size_t lineNumber,TestTerminator *testTerminator)

{
  TestTerminator *lineNumber_00;
  size_t fileName_00;
  char *threshold_00;
  double actual_00;
  double expected_00;
  bool bVar1;
  TestResult *pTVar2;
  SimpleString local_c0;
  DoublesEqualFailure local_b0;
  TestTerminator *local_48;
  TestTerminator *testTerminator_local;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  double threshold_local;
  double actual_local;
  double expected_local;
  UtestShell *this_local;
  
  local_48 = testTerminator;
  testTerminator_local = (TestTerminator *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = (char *)threshold;
  threshold_local = actual;
  actual_local = expected;
  expected_local = (double)this;
  pTVar2 = getTestResult(this);
  (*pTVar2->_vptr_TestResult[10])();
  bVar1 = doubles_equal(actual_local,threshold_local,(double)text_local);
  expected_00 = actual_local;
  actual_00 = threshold_local;
  threshold_00 = text_local;
  fileName_00 = lineNumber_local;
  lineNumber_00 = testTerminator_local;
  if (!bVar1) {
    SimpleString::SimpleString(&local_c0,fileName_local);
    DoublesEqualFailure::DoublesEqualFailure
              (&local_b0,this,(char *)fileName_00,(size_t)lineNumber_00,expected_00,actual_00,
               (double)threshold_00,&local_c0);
    (*this->_vptr_UtestShell[0x27])(this,&local_b0,local_48);
    DoublesEqualFailure::~DoublesEqualFailure(&local_b0);
    SimpleString::~SimpleString(&local_c0);
  }
  return;
}

Assistant:

void UtestShell::assertDoublesEqual(double expected, double actual, double threshold, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!doubles_equal(expected, actual, threshold))
        failWith(DoublesEqualFailure(this, fileName, lineNumber, expected, actual, threshold, text), testTerminator);
}